

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::OptionDetails::OptionDetails
          (OptionDetails *this,string *short_,string *long_,String *desc,
          shared_ptr<const_cxxopts::Value> *val)

{
  size_t sVar1;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  shared_ptr<const_cxxopts::Value> *in_stack_ffffffffffffff58;
  string *this_00;
  string local_50 [80];
  
  this_00 = in_RDI;
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,(string *)in_RDX);
  std::__cxx11::string::string(in_RDI + 0x40,in_RCX);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x60);
  std::shared_ptr<const_cxxopts::Value>::shared_ptr
            ((shared_ptr<const_cxxopts::Value> *)this_00,in_stack_ffffffffffffff58);
  *(undefined4 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  std::operator+(__lhs,in_R8);
  sVar1 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_RCX,in_RDX);
  *(size_t *)(this_00 + 0x78) = sVar1;
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

OptionDetails
    (
      std::string short_,
      std::string long_,
      String desc,
      std::shared_ptr<const Value> val
    )
    : m_short(std::move(short_))
    , m_long(std::move(long_))
    , m_desc(std::move(desc))
    , m_value(std::move(val))
    , m_count(0)
    {
      m_hash = std::hash<std::string>{}(m_long + m_short);
    }